

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O3

int process_marker(jpeg *z,int m)

{
  uint8 **ppuVar1;
  FILE *__stream;
  uint uVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  bool bVar9;
  int sizes [16];
  int local_78 [18];
  
  if (m < 0xdb) {
    if (m == 0xc2) {
      failure_reason = "JPEG format not supported (progressive)";
    }
    else {
      if (m == 0xc4) {
        iVar3 = get8(&z->s);
        iVar4 = get8(&z->s);
        for (iVar3 = iVar4 + iVar3 * 0x100 + -2; 0 < iVar3; iVar3 = (iVar3 + -0x11) - uVar8) {
          uVar2 = get8(&z->s);
          if ((0x1f < (int)uVar2) || (uVar7 = uVar2 & 0xf, 3 < uVar7)) goto LAB_0014f826;
          lVar6 = 0;
          uVar8 = 0;
          do {
            iVar4 = get8(&z->s);
            local_78[lVar6] = iVar4;
            uVar8 = uVar8 + iVar4;
            lVar6 = lVar6 + 1;
          } while (lVar6 != 0x10);
          if (uVar2 < 0x10) {
            iVar4 = build_huffman(z->huff_dc + uVar7,local_78);
            lVar6 = 0x28;
          }
          else {
            iVar4 = build_huffman(z->huff_ac + uVar7,local_78);
            lVar6 = 0x1a68;
          }
          if (iVar4 == 0) goto LAB_0014f83d;
          if (0 < (int)uVar8) {
            uVar5 = 0;
            do {
              iVar4 = get8(&z->s);
              z->huff_dc[uVar7].values[uVar5 + lVar6 + -0x28] = (uint8)iVar4;
              uVar5 = uVar5 + 1;
            } while (uVar8 != uVar5);
          }
        }
        goto LAB_0014f895;
      }
LAB_0014f841:
      if (m == 0xfe || (m & 0xfffffff0U) == 0xe0) {
        iVar3 = get8(&z->s);
        iVar4 = get8(&z->s);
        iVar3 = iVar4 + iVar3 * 0x100 + -2;
        __stream = (FILE *)(z->s).img_file;
        if (__stream == (FILE *)0x0) {
          ppuVar1 = &(z->s).img_buffer;
          *ppuVar1 = *ppuVar1 + iVar3;
        }
        else {
          fseek(__stream,(long)iVar3,1);
        }
LAB_0014f8a0:
        bVar9 = true;
        goto LAB_0014f8a2;
      }
    }
  }
  else {
    if (m == 0xdb) {
      iVar3 = get8(&z->s);
      iVar4 = get8(&z->s);
      iVar4 = iVar3 * 0x100 + iVar4 + -2;
      iVar3 = iVar4;
      if (0 < iVar4) {
        do {
          uVar2 = get8(&z->s);
          if ((0xf < uVar2) || (3 < (uVar2 & 0xf))) goto LAB_0014f826;
          lVar6 = 0;
          do {
            iVar3 = get8(&z->s);
            z->dequant[0][(ulong)""[lVar6] + (ulong)((uVar2 & 0xf) << 6)] = (uint8)iVar3;
            lVar6 = lVar6 + 1;
          } while (lVar6 != 0x40);
          iVar3 = iVar4 + -0x41;
          bVar9 = 0x41 < iVar4;
          iVar4 = iVar3;
        } while (bVar9);
      }
LAB_0014f895:
      bVar9 = iVar3 == 0;
      goto LAB_0014f8a2;
    }
    if (m == 0xdd) {
      iVar3 = get8(&z->s);
      iVar4 = get8(&z->s);
      if (iVar4 + iVar3 * 0x100 == 4) {
        iVar3 = get8(&z->s);
        iVar4 = get8(&z->s);
        z->restart_interval = iVar4 + iVar3 * 0x100;
        goto LAB_0014f8a0;
      }
    }
    else if (m != 0xff) goto LAB_0014f841;
LAB_0014f826:
    failure_reason = "Corrupt JPEG";
  }
LAB_0014f83d:
  bVar9 = false;
LAB_0014f8a2:
  return (int)bVar9;
}

Assistant:

static int process_marker(jpeg *z, int m)
{
   int L;
   switch (m) {
      case MARKER_none: // no marker found
         return e("expected marker","Corrupt JPEG");

      case 0xC2: // SOF - progressive
         return e("progressive jpeg","JPEG format not supported (progressive)");

      case 0xDD: // DRI - specify restart interval
         if (get16(&z->s) != 4) return e("bad DRI len","Corrupt JPEG");
         z->restart_interval = get16(&z->s);
         return 1;

      case 0xDB: // DQT - define quantization table
         L = get16(&z->s)-2;
         while (L > 0) {
            int q = get8(&z->s);
            int p = q >> 4;
            int t = q & 15,i;
            if (p != 0) return e("bad DQT type","Corrupt JPEG");
            if (t > 3) return e("bad DQT table","Corrupt JPEG");
            for (i=0; i < 64; ++i)
               z->dequant[t][dezigzag[i]] = get8u(&z->s);
            #if STBI_SIMD
            for (i=0; i < 64; ++i)
               z->dequant2[t][i] = dequant[t][i];
            #endif
            L -= 65;
         }
         return L==0;

      case 0xC4: // DHT - define huffman table
         L = get16(&z->s)-2;
         while (L > 0) {
            uint8 *v;
            int sizes[16],i,m=0;
            int q = get8(&z->s);
            int tc = q >> 4;
            int th = q & 15;
            if (tc > 1 || th > 3) return e("bad DHT header","Corrupt JPEG");
            for (i=0; i < 16; ++i) {
               sizes[i] = get8(&z->s);
               m += sizes[i];
            }
            L -= 17;
            if (tc == 0) {
               if (!build_huffman(z->huff_dc+th, sizes)) return 0;
               v = z->huff_dc[th].values;
            } else {
               if (!build_huffman(z->huff_ac+th, sizes)) return 0;
               v = z->huff_ac[th].values;
            }
            for (i=0; i < m; ++i)
               v[i] = get8u(&z->s);
            L -= m;
         }
         return L==0;
   }
   // check for comment block or APP blocks
   if ((m >= 0xE0 && m <= 0xEF) || m == 0xFE) {
      skip(&z->s, get16(&z->s)-2);
      return 1;
   }
   return 0;
}